

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O2

BOOL find_dupname_details
               (PCRE2_SPTR16 name,uint32_t length,int *indexptr,int *countptr,int *errorcodeptr,
               compile_block_16 *cb)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  BOOL BVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong len;
  PCRE2_SPTR16 str2;
  ushort *puVar8;
  
  puVar8 = cb->name_table;
  len = (ulong)length;
  for (uVar7 = 0; uVar1 = cb->names_found, uVar7 < uVar1; uVar7 = uVar7 + 1) {
    iVar2 = _pcre2_strncmp_16(name,puVar8 + 1,len);
    if ((iVar2 == 0) && (puVar8[length + 1] == 0)) {
      uVar1 = cb->names_found;
      break;
    }
    puVar8 = puVar8 + cb->name_entry_size;
  }
  if (uVar7 < uVar1) {
    *indexptr = uVar7;
    iVar2 = 1;
    do {
      iVar3 = iVar2;
      uVar5 = (uint)*puVar8;
      uVar6 = 1 << ((byte)*puVar8 & 0x1f);
      if (0x1f < uVar5) {
        uVar6 = 1;
      }
      cb->backref_map = cb->backref_map | uVar6;
      if (cb->top_backref < uVar5) {
        cb->top_backref = uVar5;
      }
      if ((uint)cb->names_found <= iVar3 + uVar7) break;
      uVar1 = cb->name_entry_size;
      str2 = puVar8 + (ulong)uVar1 + 1;
      iVar2 = _pcre2_strncmp_16(name,str2,len);
      if (iVar2 != 0) break;
      puVar8 = puVar8 + uVar1;
      iVar2 = iVar3 + 1;
    } while (str2[len] == 0);
    *countptr = iVar3;
    BVar4 = 1;
  }
  else {
    *errorcodeptr = 0x99;
    cb->erroroffset = (long)name - (long)cb->start_pattern >> 1;
    BVar4 = 0;
  }
  return BVar4;
}

Assistant:

static BOOL
find_dupname_details(PCRE2_SPTR name, uint32_t length, int *indexptr,
  int *countptr, int *errorcodeptr, compile_block *cb)
{
uint32_t i, groupnumber;
int count;
PCRE2_UCHAR *slot = cb->name_table;

/* Find the first entry in the table */

for (i = 0; i < cb->names_found; i++)
  {
  if (PRIV(strncmp)(name, slot+IMM2_SIZE, length) == 0 &&
      slot[IMM2_SIZE+length] == 0) break;
  slot += cb->name_entry_size;
  }

/* This should not occur, because this function is called only when we know we
have duplicate names. Give an internal error. */

if (i >= cb->names_found)
  {
  *errorcodeptr = ERR53;
  cb->erroroffset = name - cb->start_pattern;
  return FALSE;
  }

/* Record the index and then see how many duplicates there are, updating the
backref map and maximum back reference as we do. */

*indexptr = i;
count = 0;

for (;;)
  {
  count++;
  groupnumber = GET2(slot,0);
  cb->backref_map |= (groupnumber < 32)? (1u << groupnumber) : 1;
  if (groupnumber > cb->top_backref) cb->top_backref = groupnumber;
  if (++i >= cb->names_found) break;
  slot += cb->name_entry_size;
  if (PRIV(strncmp)(name, slot+IMM2_SIZE, length) != 0 ||
    (slot+IMM2_SIZE)[length] != 0) break;
  }

*countptr = count;
return TRUE;
}